

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O1

QMatrix * Add_QQ(QMatrix *Q1,QMatrix *Q2)

{
  LASErrIdType LVar1;
  char *pcVar2;
  char *pcVar3;
  QMatrix *Q;
  size_t sVar4;
  size_t sVar5;
  char *Object2Name;
  
  Q_Lock(Q1);
  Q_Lock(Q2);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if (Q1->Dim == Q2->Dim) {
      if ((((Q1->Symmetry == Q2->Symmetry) && (Q1->ElOrder == Q2->ElOrder)) && (Q1->Len == Q2->Len))
         && (Q1->El == Q2->El)) {
        Q = (QMatrix *)malloc(0xb0);
        pcVar2 = Q_GetName(Q1);
        sVar4 = strlen(pcVar2);
        pcVar2 = Q_GetName(Q1);
        sVar5 = strlen(pcVar2);
        pcVar2 = (char *)malloc(sVar4 + sVar5 + 10);
        pcVar3 = Q_GetName(Q1);
        Object2Name = Q_GetName(Q2);
        if ((Q == (QMatrix *)0x0) || (pcVar2 == (char *)0x0)) {
          LASError(LASMemAllocErr,"Add_QQ",pcVar3,Object2Name,(char *)0x0);
          if (Q != (QMatrix *)0x0) {
            free(Q);
          }
        }
        else {
          sprintf(pcVar2,"%s + %s",pcVar3,Object2Name);
          Q_Constr(Q,pcVar2,Q1->Dim,Q1->Symmetry,Q1->ElOrder,Tempor,False);
          LVar1 = LASResult();
          if (LVar1 == LASOK) {
            Q->MultiplD = Q1->MultiplD + Q2->MultiplD;
            Q->MultiplU = Q1->MultiplU + Q2->MultiplU;
            Q->MultiplL = Q1->MultiplL + Q2->MultiplL;
            Q->Len = Q1->Len;
            Q->El = Q1->El;
            Q->ElSorted = Q1->ElSorted;
            Q->DiagElAlloc = Q1->DiagElAlloc;
            Q->DiagEl = Q1->DiagEl;
            Q->ZeroInDiag = Q1->ZeroInDiag;
            Q->InvDiagEl = Q1->InvDiagEl;
            Q->UnitRightKer = Q1->UnitRightKer;
            Q->RightKerCmp = Q1->RightKerCmp;
            Q->UnitLeftKer = Q1->UnitLeftKer;
            Q->LeftKerCmp = Q1->LeftKerCmp;
            Q->ILUExists = Q1->ILUExists;
            Q->ILU = Q1->ILU;
          }
        }
        if (pcVar2 != (char *)0x0) {
          free(pcVar2);
        }
        goto LAB_0010b10e;
      }
      pcVar2 = Q_GetName(Q1);
      pcVar3 = Q_GetName(Q2);
      LVar1 = LASMatrCombErr;
    }
    else {
      pcVar2 = Q_GetName(Q1);
      pcVar3 = Q_GetName(Q2);
      LVar1 = LASDimErr;
    }
    Q = (QMatrix *)0x0;
    LASError(LVar1,"Add_QQ",pcVar2,pcVar3,(char *)0x0);
  }
  else {
    Q = (QMatrix *)0x0;
  }
LAB_0010b10e:
  Q_Unlock(Q1);
  Q_Unlock(Q2);
  return Q;
}

Assistant:

QMatrix *Add_QQ(QMatrix *Q1, QMatrix *Q2)
/* QRes = Q1 + Q2, this operation is limited to matrices, which are
   derived from the same matrix */
{
    QMatrix *QRes;

    char *QResName;

    Q_Lock(Q1);
    Q_Lock(Q2);
    
    if (LASResult() == LASOK) {
        if (Q1->Dim == Q2->Dim) {
            if (Q1->Symmetry == Q2->Symmetry &&
                Q1->ElOrder == Q2->ElOrder &&
                Q1->Len == Q2->Len &&
                Q1->El == Q2->El) {
                QRes = (QMatrix *)malloc(sizeof(QMatrix));
                QResName = (char *)malloc((strlen(Q_GetName(Q1)) + strlen(Q_GetName(Q1)) + 10)
                           * sizeof(char));
                if (QRes != NULL && QResName != NULL) {
                    sprintf(QResName, "%s + %s", Q_GetName(Q1), Q_GetName(Q2));
                    Q_Constr(QRes, QResName, Q1->Dim, Q1->Symmetry, Q1->ElOrder, Tempor, False);
                    if (LASResult() == LASOK) {
                        QRes->MultiplD = Q1->MultiplD + Q2->MultiplD;
                        QRes->MultiplU = Q1->MultiplU + Q2->MultiplU;
                        QRes->MultiplL = Q1->MultiplL + Q2->MultiplL;
                        QRes->Len = Q1->Len;
                        QRes->El = Q1->El;
                        QRes->ElSorted = Q1->ElSorted;
                        QRes->DiagElAlloc = Q1->DiagElAlloc;
                        QRes->DiagEl = Q1->DiagEl;
                        QRes->ZeroInDiag = Q1->ZeroInDiag;
                        QRes->InvDiagEl = Q1->InvDiagEl;
                        QRes->UnitRightKer = Q1->UnitRightKer;
                        QRes->RightKerCmp = Q1->RightKerCmp;
                        QRes->UnitLeftKer = Q1->UnitLeftKer;
                        QRes->LeftKerCmp = Q1->LeftKerCmp;
                        QRes->ILUExists = Q1->ILUExists;
                        QRes->ILU = Q1->ILU;
                    }
                } else {
                    LASError(LASMemAllocErr, "Add_QQ", Q_GetName(Q1), Q_GetName(Q2), NULL);
                    if (QRes != NULL)
                        free(QRes);
                }
            
                if (QResName != NULL)
                    free(QResName);
            } else {
                LASError(LASMatrCombErr, "Add_QQ", Q_GetName(Q1), Q_GetName(Q2), NULL);
                QRes = NULL;
            }
        } else {
            LASError(LASDimErr, "Add_QQ", Q_GetName(Q1), Q_GetName(Q2), NULL);
            QRes = NULL;
        }
    } else {
        QRes = NULL;
    }

    Q_Unlock(Q1);
    Q_Unlock(Q2);

    return(QRes);
}